

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.h
# Opt level: O3

TPX * __thiscall
r_exec::AutoFocusController::build_tpx<r_exec::PTPX>
          (AutoFocusController *this,_Fact *target,_Fact *pattern,BindingMap *bm,RatingMap *map,
          Fact *f_imdl,bool wr_enabled)

{
  atomic_int_fast64_t *paVar1;
  PTPX *this_00;
  iterator iVar2;
  long lVar3;
  TPX *this_01;
  key_type local_40;
  double local_38;
  
  if ((this->_gtpx_on == false) && (this->_ptpx_on == false)) {
    this_00 = (PTPX *)operator_new(0x50);
    TPX::TPX((TPX *)this_00,this,target,pattern,bm);
  }
  else if (wr_enabled) {
    this_00 = (PTPX *)operator_new(0x50);
    TPX::TPX((TPX *)this_00,this,target,pattern,bm);
  }
  else {
    if (pattern != (_Fact *)0x0) {
      LOCK();
      paVar1 = &(pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    local_40.object = (_Object *)pattern;
    iVar2 = std::
            _Hashtable<core::P<r_exec::_Fact>,_std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>_>,_std::__detail::_Select1st,_std::equal_to<core::P<r_exec::_Fact>_>,_r_code::PHash<r_exec::_Fact>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&map->_M_h,&local_40);
    if (local_40.object != (_Object *)0x0) {
      LOCK();
      ((local_40.object)->refCount).super___atomic_base<long>._M_i =
           ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
        (*(((LObject *)&(local_40.object)->_vptr__Object)->
          super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.super__Object.
          _vptr__Object[1])();
      }
    }
    if (iVar2.
        super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (PTPX *)operator_new(0xe0);
      PTPX::PTPX(this_00,this,target,pattern,bm,f_imdl);
    }
    else {
      if ((0.0 < *(double *)
                  ((long)iVar2.
                         super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
                         ._M_cur + 0x28)) &&
         (local_38 = *(double *)
                      ((long)iVar2.
                             super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
                             ._M_cur + 0x28), lVar3 = r_code::Mem::Get(),
         local_38 < *(double *)(lVar3 + 0x30))) {
        this_01 = (TPX *)operator_new(0x50);
        TPX::TPX(this_01,this,target,pattern,bm);
        return this_01;
      }
      this_00 = (PTPX *)operator_new(0xe0);
      PTPX::PTPX(this_00,this,target,pattern,bm,f_imdl);
    }
  }
  return (TPX *)this_00;
}

Assistant:

TPX *build_tpx(_Fact *target, _Fact *pattern, BindingMap *bm, RatingMap &map, Fact *f_imdl, bool wr_enabled)
    {
        if (!_gtpx_on && !_ptpx_on) {
            return new TPX(this, target, pattern, bm);
        }

        if (wr_enabled) {
            return new TPX(this, target, pattern, bm);
        }

        RatingMap::const_iterator r = map.find(pattern);

        if (r != map.end()) {
            if (Rating::DSR(r->second.dSR)) { // target for which we don't see much improvement over time.
                return new TPX(this, target, pattern, bm);
            } else {
                return new T(this, target, pattern, bm, f_imdl);
            }
        } else {
            return new T(this, target, pattern, bm, f_imdl);
        }
    }